

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O1

int handle_start_map(void *ctx)

{
  int iVar1;
  yajl_val v;
  uint uVar2;
  
  v = (yajl_val)malloc(0x28);
  if (v == (yajl_val)0x0) {
    v = (yajl_val)0x0;
  }
  else {
    *(undefined8 *)v = 0;
    (v->u).string = (char *)0x0;
    (v->u).number.d = 0.0;
    (v->u).number.r = (char *)0x0;
    *(undefined8 *)((long)&v->u + 0x18) = 0;
    v->type = yajl_t_object;
  }
  if (v == (yajl_val)0x0) {
    if (*(char **)((long)ctx + 0x10) == (char *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      snprintf(*(char **)((long)ctx + 0x10),*(size_t *)((long)ctx + 0x18),"Out of memory");
    }
  }
  else {
    (v->u).string = (char *)0x0;
    (v->u).number.d = 0.0;
    (v->u).number.r = (char *)0x0;
    iVar1 = context_push((context_t *)ctx,v);
    uVar2 = (uint)(iVar1 == 0);
  }
  return uVar2;
}

Assistant:

static int handle_start_map (void *ctx)
{
    yajl_val v;

    v = value_alloc(yajl_t_object);
    if (v == NULL)
        RETURN_ERROR ((context_t *) ctx, STATUS_ABORT, "Out of memory");

    v->u.object.keys = NULL;
    v->u.object.values = NULL;
    v->u.object.len = 0;

    return ((context_push (ctx, v) == 0) ? STATUS_CONTINUE : STATUS_ABORT);
}